

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::absI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *this_local;
  
  unary<16,_&wasm::Literal::getLanesSI8x16,_&wasm::Literal::abs>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::absI8x16() const {
  return unary<16, &Literal::getLanesSI8x16, &Literal::abs>(*this);
}